

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O3

int __thiscall deqp::egl::InfoTests::init(InfoTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCase *pTVar1;
  TestNode *node;
  
  pTVar1 = (TestCase *)operator_new(0x90);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"version","EGL Version");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_02114260;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0x3054;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x90);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"vendor","EGL Vendor");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_02114260;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0x3053;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x90);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"client_apis",
                     "Supported client APIs");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_02114260;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0x308d;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x88);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"extensions",
                     "Supported Extensions");
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_021142c8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  node = (TestNode *)operator_new(0x78);
  ConfigList::ConfigList((ConfigList *)node,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void InfoTests::init (void)
{
	addChild(new QueryStringCase(m_eglTestCtx, "version",		"EGL Version",				EGL_VERSION));
	addChild(new QueryStringCase(m_eglTestCtx, "vendor",		"EGL Vendor",				EGL_VENDOR));
	addChild(new QueryStringCase(m_eglTestCtx, "client_apis",	"Supported client APIs",	EGL_CLIENT_APIS));
	addChild(new QueryExtensionsCase(m_eglTestCtx));
	addChild(new ConfigList(m_eglTestCtx));
}